

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateParams(z_streamp strm,int level,int strategy)

{
  internal_state_conflict *piVar1;
  int local_34;
  int err;
  compress_func func;
  deflate_state *s;
  int strategy_local;
  int level_local;
  z_streamp strm_local;
  
  local_34 = 0;
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state_conflict *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    s._4_4_ = level;
    if (level == -1) {
      s._4_4_ = 6;
    }
    if ((((s._4_4_ < 0) || (9 < s._4_4_)) || (strategy < 0)) || (4 < strategy)) {
      strm_local._4_4_ = -2;
    }
    else {
      if (((strategy != piVar1->strategy) ||
          (configuration_table[piVar1->level].func != configuration_table[s._4_4_].func)) &&
         (strm->total_in != 0)) {
        local_34 = deflate(strm,5);
      }
      if (piVar1->level != s._4_4_) {
        piVar1->level = s._4_4_;
        piVar1->max_lazy_match = (uint)configuration_table[s._4_4_].max_lazy;
        piVar1->good_match = (uint)configuration_table[s._4_4_].good_length;
        piVar1->nice_match = (uint)configuration_table[s._4_4_].nice_length;
        piVar1->max_chain_length = (uint)configuration_table[s._4_4_].max_chain;
      }
      piVar1->strategy = strategy;
      strm_local._4_4_ = local_34;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateParams(z_streamp strm, int level, int strategy)
{
    deflate_state *s;
    compress_func func;
    int err = Z_OK;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if ((strategy != s->strategy || func != configuration_table[level].func) &&
        strm->total_in != 0) {
        /* Flush the last buffer: */
        err = deflate(strm, Z_BLOCK);
    }
    if (s->level != level) {
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return err;
}